

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLit0_local;
  int iLit1_local;
  int iLitC_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManAppendObj(p);
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2ed,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (-1 < iLit0) {
    iVar2 = Abc_Lit2Var(iLit0);
    iVar3 = Gia_ManObjNum(p);
    if (iVar2 < iVar3) {
      if (-1 < iLit1) {
        iVar2 = Abc_Lit2Var(iLit1);
        iVar3 = Gia_ManObjNum(p);
        if (iVar2 < iVar3) {
          if (-1 < iLitC) {
            iVar2 = Abc_Lit2Var(iLitC);
            iVar3 = Gia_ManObjNum(p);
            if (iVar2 < iVar3) {
              iVar2 = Abc_Lit2Var(iLit0);
              iVar3 = Abc_Lit2Var(iLit1);
              if (iVar2 == iVar3) {
                __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x2f1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
              }
              iVar2 = Abc_Lit2Var(iLitC);
              iVar3 = Abc_Lit2Var(iLit0);
              if (iVar2 != iVar3) {
                iVar2 = Abc_Lit2Var(iLitC);
                iVar3 = Abc_Lit2Var(iLit1);
                if (iVar2 == iVar3) {
                  __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x2f3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                iVar2 = Vec_IntSize(&p->vHTable);
                if (iVar2 != 0) {
                  iVar2 = Abc_LitIsCompl(iLit1);
                  if (iVar2 != 0) {
                    __assert_fail("!Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x2f4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                  }
                }
                iVar2 = Abc_Lit2Var(iLit0);
                iVar3 = Abc_Lit2Var(iLit1);
                if (iVar2 < iVar3) {
                  iVar2 = Gia_ObjId(p,pObj_00);
                  iVar3 = Abc_Lit2Var(iLit0);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xffffffffe0000000 |
                       (ulong)(uint)(iVar2 - iVar3) & 0x1fffffff;
                  uVar4 = Abc_LitIsCompl(iLit0);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar4 & 1) << 0x1d;
                  iVar2 = Gia_ObjId(p,pObj_00);
                  iVar3 = Abc_Lit2Var(iLit1);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xe0000000ffffffff |
                       ((ulong)(uint)(iVar2 - iVar3) & 0x1fffffff) << 0x20;
                  uVar4 = Abc_LitIsCompl(iLit1);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar4 & 1) << 0x3d;
                  puVar1 = p->pMuxes;
                  iVar2 = Gia_ObjId(p,pObj_00);
                  puVar1[iVar2] = iLitC;
                }
                else {
                  iVar2 = Gia_ObjId(p,pObj_00);
                  iVar3 = Abc_Lit2Var(iLit0);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xe0000000ffffffff |
                       ((ulong)(uint)(iVar2 - iVar3) & 0x1fffffff) << 0x20;
                  uVar4 = Abc_LitIsCompl(iLit0);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar4 & 1) << 0x3d;
                  iVar2 = Gia_ObjId(p,pObj_00);
                  iVar3 = Abc_Lit2Var(iLit1);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xffffffffe0000000 |
                       (ulong)(uint)(iVar2 - iVar3) & 0x1fffffff;
                  uVar4 = Abc_LitIsCompl(iLit1);
                  *(ulong *)pObj_00 =
                       *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar4 & 1) << 0x1d;
                  uVar4 = Abc_LitNot(iLitC);
                  puVar1 = p->pMuxes;
                  iVar2 = Gia_ObjId(p,pObj_00);
                  puVar1[iVar2] = uVar4;
                }
                p->nMuxes = p->nMuxes + 1;
                iVar2 = Gia_ObjId(p,pObj_00);
                return iVar2 << 1;
              }
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2f2,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
          }
          __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2f0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
        }
      }
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2ef,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
    }
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x2ee,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
}

Assistant:

static inline int Gia_ManAppendMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( p->pMuxes != NULL );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1) );
    assert( !Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) < Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
        p->pMuxes[Gia_ObjId(p, pObj)] = iLitC;
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
        p->pMuxes[Gia_ObjId(p, pObj)] = Abc_LitNot(iLitC);
    }
    p->nMuxes++;
    return Gia_ObjId( p, pObj ) << 1;
}